

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ExprUnmapAndDelete(Parse *pParse,Expr *p)

{
  byte bVar1;
  u8 eMode;
  long in_FS_OFFSET;
  Walker local_58;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (p != (Expr *)0x0) {
    bVar1 = pParse->eParseMode;
    if (1 < bVar1) {
      local_58.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
      local_58.walkerDepth = 0;
      local_58.eCode = 0;
      local_58.mWFlags = 0;
      local_58.u.pNC = (NameContext *)0x0;
      local_58.xExprCallback = renameUnmapExprCb;
      local_58.xSelectCallback = renameUnmapSelectCb;
      pParse->eParseMode = '\x03';
      local_58.pParse = pParse;
      sqlite3WalkExprNN(&local_58,p);
      pParse->eParseMode = bVar1;
    }
    sqlite3ExprDeleteNN(pParse->db,p);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprUnmapAndDelete(Parse *pParse, Expr *p){
  if( p ){
    if( IN_RENAME_OBJECT ){
      sqlite3RenameExprUnmap(pParse, p);
    }
    sqlite3ExprDeleteNN(pParse->db, p);
  }
}